

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatabaseSnapshot.cpp
# Opt level: O0

DatabaseName * __thiscall DatabaseSnapshot::allocate_name(DatabaseSnapshot *this,string *type)

{
  bool bVar1;
  path *this_00;
  path *__p;
  ostream *poVar2;
  path *this_01;
  string *in_RDX;
  long in_RSI;
  DatabaseName *in_RDI;
  ExclusiveFile lock;
  string fname;
  string id;
  stringstream ss;
  undefined7 in_stack_fffffffffffffc58;
  undefined1 in_stack_fffffffffffffc5f;
  DatabaseName *this_02;
  undefined4 in_stack_fffffffffffffca0;
  undefined4 in_stack_fffffffffffffca4;
  uint uVar3;
  string *in_stack_fffffffffffffca8;
  string *in_stack_fffffffffffffcb0;
  path *in_stack_fffffffffffffcb8;
  DatabaseName *in_stack_fffffffffffffcc0;
  uint64_t in_stack_fffffffffffffcc8;
  string local_318 [224];
  string local_238 [36];
  ExclusiveFile local_214;
  string local_210 [32];
  string local_1f0 [48];
  string local_1c0 [32];
  stringstream local_1a0 [16];
  ostream local_190 [376];
  string *local_18;
  
  this_02 = in_RDI;
  local_18 = in_RDX;
  while( true ) {
    std::__cxx11::stringstream::stringstream(local_1a0);
    random_hex_string_abi_cxx11_(in_stack_fffffffffffffcc8);
    this_00 = (path *)std::operator<<(local_190,local_18);
    __p = (path *)std::operator<<((ostream *)this_00,".");
    poVar2 = std::operator<<((ostream *)__p,local_1c0);
    poVar2 = std::operator<<(poVar2,".");
    std::experimental::filesystem::v1::__cxx11::path::string(&this_02->db_base);
    std::operator<<(poVar2,local_1f0);
    std::__cxx11::string::~string(local_1f0);
    std::__cxx11::stringstream::str();
    this_01 = (path *)(in_RSI + 0x40);
    std::experimental::filesystem::v1::__cxx11::path::
    path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>
              (this_00,&__p->_M_pathname);
    std::experimental::filesystem::v1::__cxx11::operator/(&this_02->db_base,this_00);
    std::experimental::filesystem::v1::__cxx11::path::operator_cast_to_string
              ((path *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58));
    ExclusiveFile::ExclusiveFile
              ((ExclusiveFile *)this_01,
               (string *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58));
    std::__cxx11::string::~string(local_238);
    std::experimental::filesystem::v1::__cxx11::path::~path(this_01);
    std::experimental::filesystem::v1::__cxx11::path::~path(this_01);
    bVar1 = ExclusiveFile::is_ok(&local_214);
    in_stack_fffffffffffffc5f = bVar1;
    if (bVar1) {
      std::experimental::filesystem::v1::__cxx11::path::path(this_00,__p);
      std::__cxx11::string::string(local_318,local_18);
      std::__cxx11::string::string((string *)&stack0xfffffffffffffcc8,local_1c0);
      std::__cxx11::string::string((string *)&stack0xfffffffffffffca8,local_210);
      DatabaseName::DatabaseName
                (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,
                 in_stack_fffffffffffffca8,
                 (string *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0));
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffca8);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffcc8);
      std::__cxx11::string::~string(local_318);
      std::experimental::filesystem::v1::__cxx11::path::~path(this_01);
    }
    uVar3 = (uint)bVar1;
    ExclusiveFile::~ExclusiveFile((ExclusiveFile *)this_01);
    std::__cxx11::string::~string(local_210);
    std::__cxx11::string::~string(local_1c0);
    std::__cxx11::stringstream::~stringstream(local_1a0);
    if (uVar3 != 0) break;
    in_stack_fffffffffffffca4 = 0;
  }
  return in_RDI;
}

Assistant:

DatabaseName DatabaseSnapshot::allocate_name(const std::string &type) const {
    while (true) {
        // TODO(unknown): limit this to some sane value (like 10000 etc),
        // to avoid infinite loop in exceptional cases.

        std::stringstream ss;
        std::string id(random_hex_string(8));
        ss << type << "." << id << "." << db_name.string();
        std::string fname = ss.str();
        ExclusiveFile lock(db_base / fname);
        if (lock.is_ok()) {
            return DatabaseName(db_base, type, id, fname);
        }
    }
}